

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Shader.cpp
# Opt level: O0

bool anon_unknown.dwarf_1fa080::getFileContents
               (string *filename,vector<char,_std::allocator<char>_> *buffer)

{
  bool bVar1;
  char *pcVar2;
  size_type __new_size;
  vector<char,_std::allocator<char>_> *in_RSI;
  pos_type size;
  ifstream file;
  reference in_stack_fffffffffffffd78;
  vector<char,_std::allocator<char>_> *in_stack_fffffffffffffd80;
  vector<char,_std::allocator<char>_> *this;
  undefined1 local_240 [2] [16];
  long local_220 [65];
  vector<char,_std::allocator<char>_> *local_18;
  byte local_1;
  
  local_18 = in_RSI;
  pcVar2 = (char *)std::__cxx11::string::c_str();
  std::ifstream::ifstream(local_220,pcVar2,_S_bin);
  bVar1 = std::ios::operator_cast_to_bool
                    ((ios *)((long)local_220 + *(long *)(local_220[0] + -0x18)));
  if (bVar1) {
    std::istream::seekg((long)local_220,_S_beg);
    local_240[0] = std::istream::tellg();
    this = local_240[0]._8_8_;
    __new_size = std::fpos::operator_cast_to_long((fpos *)local_240);
    if (0 < (long)__new_size) {
      std::istream::seekg((long)local_220,_S_beg);
      std::fpos::operator_cast_to_long((fpos *)local_240);
      std::vector<char,_std::allocator<char>_>::resize(this,__new_size);
      in_stack_fffffffffffffd78 = std::vector<char,_std::allocator<char>_>::operator[](local_18,0);
      in_stack_fffffffffffffd80 =
           (vector<char,_std::allocator<char>_> *)
           std::fpos::operator_cast_to_long((fpos *)local_240);
      std::istream::read((char *)local_220,(long)in_stack_fffffffffffffd78);
    }
    Catch::clara::std::vector<char,_std::allocator<char>_>::push_back
              (in_stack_fffffffffffffd80,in_stack_fffffffffffffd78);
    local_1 = 1;
  }
  else {
    local_1 = 0;
  }
  std::ifstream::~ifstream(local_220);
  return (bool)(local_1 & 1);
}

Assistant:

bool getFileContents(const std::string& filename, std::vector<char>& buffer)
    {
        std::ifstream file(filename.c_str(), std::ios_base::binary);
        if (file)
        {
            file.seekg(0, std::ios_base::end);
            std::ifstream::pos_type size = file.tellg();
            if (size > 0)
            {
                file.seekg(0, std::ios_base::beg);
                buffer.resize(static_cast<std::size_t>(size));
                file.read(&buffer[0], static_cast<std::streamsize>(size));
            }
            buffer.push_back('\0');
            return true;
        }
        else
        {
            return false;
        }
    }